

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C_matrix.h
# Opt level: O3

void __thiscall C_matrix<double>::C_matrix(C_matrix<double> *this,int _L,int _C)

{
  double *pdVar1;
  ulong uVar2;
  double local_50;
  C_matrix<double> local_48;
  
  this->_vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  this->m_L = _L;
  this->m_C = _C;
  uVar2 = 0xffffffffffffffff;
  if (-1 < _C * _L) {
    uVar2 = (ulong)(uint)(_C * _L) * 8;
  }
  pdVar1 = (double *)operator_new__(uVar2);
  this->m_A = pdVar1;
  this->endL = _L + -1;
  this->endC = _C + -1;
  local_50 = 0.0;
  operator=(&local_48,this,&local_50);
  local_48._vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d60;
  if (local_48.m_A != (double *)0x0) {
    operator_delete__(local_48.m_A);
  }
  return;
}

Assistant:

C_matrix<dataType>::C_matrix(int _L, int _C) : m_L(_L),m_C(_C)
{
    m_A = allocate(m_L,m_C);
    if(m_A==NULL)
    {
        m_L=0;
        m_C=0;
    }
    endL = m_L-1;
    endC = m_C-1;
    *this = 0.0;
}